

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Medals.cpp
# Opt level: O3

void __thiscall
RenX_MedalsPlugin::RenX_OnJoin(RenX_MedalsPlugin *this,Server *server,PlayerInfo *player)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ulong uVar2;
  Server *pSVar3;
  char cVar4;
  int iVar5;
  unsigned_long uVar6;
  unsigned_long uVar7;
  long lVar8;
  const_iterator cVar9;
  undefined8 uVar10;
  undefined1 auVar11 [16];
  string tagged_msg;
  string local_58;
  Server *local_38;
  
  if ((((player->uuid)._M_string_length != 0) && (player->isBot == false)) &&
     (local_38 = server, cVar4 = RenX::Server::isMatchInProgress(), cVar4 != '\0')) {
    uVar6 = getRecs(player);
    uVar7 = getNoobs(player);
    lVar8 = Jupiter::Config::getSection
                      (&this->field_0x38,(this->firstSection)._M_string_length,
                       (this->firstSection)._M_dataplus._M_p);
    if (lVar8 != 0) {
      do {
        local_58._M_dataplus._M_p = (pointer)0x7;
        local_58._M_string_length = 0x10f173;
        cVar9 = std::
                _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,jessilib::text_equali,jessilib::text_hashi,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                ::_M_find_tr<std::basic_string_view<char,std::char_traits<char>>,void,void>
                          ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,jessilib::text_equali,jessilib::text_hashi,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                            *)(lVar8 + 0x28),
                           (basic_string_view<char,_std::char_traits<char>_> *)&local_58);
        if ((cVar9.
             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
             ._M_cur == (__node_type *)0x0) ||
           (iVar5 = Jupiter_strtoi_s(*(undefined8 *)
                                      ((long)cVar9.
                                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                                             ._M_cur + 0x28),
                                     *(undefined8 *)
                                      ((long)cVar9.
                                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                                             ._M_cur + 0x30),0), (int)uVar6 - (int)uVar7 <= iVar5))
        {
          uVar2 = *(ulong *)(lVar8 + 0x40);
          if (uVar2 == 0) {
            return;
          }
          iVar5 = rand();
          string_printf_abi_cxx11_(&local_58,"%u",(ulong)(long)iVar5 % uVar2 + 1);
          auVar11 = Jupiter::Config::get(lVar8,local_58._M_string_length,local_58._M_dataplus._M_p);
          paVar1 = &local_58.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != paVar1) {
            operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
          }
          if (auVar11._0_8_ == 0) {
            return;
          }
          local_58._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_58,auVar11._8_8_,auVar11._0_8_ + auVar11._8_8_);
          RenX::sanitizeTags((string *)&local_58);
          pSVar3 = local_38;
          RenX::processTags((string *)&local_58,local_38,player,(PlayerInfo *)0x0,
                            (BuildingInfo *)0x0);
          RenX::Server::sendMessage(pSVar3,local_58._M_string_length,local_58._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p == paVar1) {
            return;
          }
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
          return;
        }
        uVar10 = Jupiter::Config::get(lVar8,0xb,"NextSection");
        lVar8 = Jupiter::Config::getSection(&this->field_0x38,uVar10);
      } while (lVar8 != 0);
    }
  }
  return;
}

Assistant:

void RenX_MedalsPlugin::RenX_OnJoin(RenX::Server &server, const RenX::PlayerInfo &player) {
	if (!player.uuid.empty() && player.isBot == false && server.isMatchInProgress()) {
		int worth = getWorth(player);
		Jupiter::Config *section = RenX_MedalsPlugin::config.getSection(RenX_MedalsPlugin::firstSection);
		if (section != nullptr) {
			while (section->get<int>("MaxRecs"sv, std::numeric_limits<int>::max()) < worth) {
				if ((section = RenX_MedalsPlugin::config.getSection(section->get("NextSection"sv))) == nullptr) {
					return; // No matching section found.
				}
			}

			size_t table_size = section->getTable().size();

			if (table_size != 0) {
				std::string_view msg = section->get(string_printf("%u", (rand() % table_size) + 1));

				if (!msg.empty()) {
					std::string tagged_msg = static_cast<std::string>(msg);
					RenX::sanitizeTags(tagged_msg);
					RenX::processTags(tagged_msg, &server, &player);
					server.sendMessage(tagged_msg);
				}
			}
		}
	}
}